

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_assert(slab_cache *cache,slab *slab)

{
  byte order;
  pthread_t __thread1;
  uint __line;
  int iVar1;
  pthread_t __thread2;
  size_t sVar2;
  char *__assertion;
  
  __thread1 = cache->thread_id;
  __thread2 = pthread_self();
  iVar1 = pthread_equal(__thread1,__thread2);
  if (iVar1 == 0) {
    __assertion = "pthread_equal(cache->thread_id, pthread_self())";
    __line = 0x42;
  }
  else if (slab->magic == 0xeec0ffee) {
    order = slab->order;
    if (cache->order_max + 1 < (uint)order) {
      __assertion = "slab->order <= cache->order_max + 1";
      __line = 0x44;
    }
    else {
      if (cache->order_max < order) {
        return;
      }
      sVar2 = slab_order_size(cache,order);
      if (slab->size == sVar2) {
        if ((sVar2 - 1 & (ulong)slab) == 0) {
          return;
        }
        __assertion = "addr == (intptr_t) (addr & ~(size - 1))";
        __line = 0x4b;
      }
      else {
        __assertion = "slab->size == size";
        __line = 0x48;
      }
    }
  }
  else {
    __assertion = "slab->magic == slab_magic";
    __line = 0x43;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                ,__line,"void slab_assert(struct slab_cache *, struct slab *)");
}

Assistant:

static inline void
slab_assert(struct slab_cache *cache, struct slab *slab)
{
	(void) slab;
	assert(pthread_equal(cache->thread_id, pthread_self()));
	assert(slab->magic == slab_magic);
	assert(slab->order <= cache->order_max + 1);
	if (slab->order <= cache->order_max) {
		size_t size = slab_order_size(cache, slab->order);
		(void) size;
		assert(slab->size == size);
		intptr_t addr = (intptr_t) slab;
		(void) addr;
		assert(addr == (intptr_t) (addr & ~(size - 1)));
	}
}